

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,RegSlot arg1Location)

{
  ProfileId callSiteId_00;
  ByteCodeWriter *pBVar1;
  ProfileId callSiteId;
  RegSlot arg1Location_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot callObjLocation_local;
  RegSlot location_local;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  FuncInfo::StartRecordingOutArgs(funcInfo,2);
  callSiteId_00 = ByteCodeGenerator::GetNextCallSiteId(byteCodeGenerator,CallI);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::StartCall(pBVar1,StartCall,2);
  EmitArgListStart(callObjLocation,byteCodeGenerator,funcInfo,callSiteId_00);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::ArgOut<true>(pBVar1,1,arg1Location,callSiteId_00,false);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::CallI(pBVar1,CallI,location,location,2,callSiteId_00,CallFlags_None);
  return;
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    Js::RegSlot arg1Location)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(2);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 2);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);
    byteCodeGenerator->Writer()->ArgOut<true>(1, arg1Location, callSiteId, false /*emitProfiledArgout*/);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 2, callSiteId);
}